

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::hasIOS11_2Features(Model *model)

{
  uint32 uVar1;
  StringVector *pSVar2;
  Rep *pRVar3;
  bool bVar4;
  long lVar5;
  Pipeline *pPVar6;
  InternalMetadataWithArenaLite *pIVar7;
  void **ppvVar8;
  long lVar9;
  bool bVar10;
  WeightParamType local_1c;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar6 = ((model->Type_).pipelineclassifier_)->pipeline_;
    if (pPVar6 == (Pipeline *)0x0) {
      pPVar6 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar8 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar8 = (void **)0x0;
    }
    lVar5 = (long)(pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar5 != 0) {
      lVar9 = 0;
      do {
        bVar4 = hasIOS11_2Features(*(Model **)((long)ppvVar8 + lVar9));
        if (bVar4) {
          return bVar4;
        }
        bVar10 = lVar5 * 8 + -8 != lVar9;
        lVar9 = lVar9 + 8;
      } while (bVar10);
      return bVar4;
    }
  }
  else if (uVar1 == 0xc9) {
    pPVar6 = ((model->Type_).pipelineclassifier_)->pipeline_;
    if (pPVar6 == (Pipeline *)0x0) {
      pPVar6 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar8 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar8 = (void **)0x0;
    }
    lVar5 = (long)(pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar5 != 0) {
      lVar9 = 0;
      do {
        bVar4 = hasIOS11_2Features(*(Model **)((long)ppvVar8 + lVar9));
        if (bVar4) {
          return bVar4;
        }
        bVar10 = lVar5 * 8 + -8 != lVar9;
        lVar9 = lVar9 + 8;
      } while (bVar10);
      return bVar4;
    }
  }
  else {
    if (uVar1 != 0xca) {
      bVar4 = hasCustomLayer(model);
      if (bVar4) {
        return true;
      }
      local_1c = FLOAT16;
      bVar4 = hasWeightOfType(model,&local_1c);
      return bVar4;
    }
    pSVar2 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
    pIVar7 = &pSVar2->_internal_metadata_;
    if (pSVar2 == (StringVector *)0x0) {
      pIVar7 = (InternalMetadataWithArenaLite *)0x0;
    }
    lVar5 = (long)((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
    if (lVar5 != 0) {
      lVar9 = 0;
      do {
        bVar4 = hasIOS11_2Features(*(Model **)
                                    ((long)&(pIVar7->
                                            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                            ).ptr_ + lVar9));
        if (bVar4) {
          return bVar4;
        }
        bVar10 = lVar5 * 8 + -8 != lVar9;
        lVar9 = lVar9 + 8;
      } while (bVar10);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS11_2Features(const Specification::Model& model) {
    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS11_2Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result || hasIOS11_2Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS11_2Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        default:
            return (hasCustomLayer(model) || hasfp16Weights(model));
    }
    return false;
}